

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scapp.h
# Opt level: O0

void __thiscall scApp::validateOptions(scApp *this)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  long *in_RDI;
  
  uVar1 = clampedOption::operator_cast_to_unsigned_int((clampedOption *)(in_RDI[0xf] + 0x108));
  uVar2 = clampedOption::operator_cast_to_unsigned_int((clampedOption *)(in_RDI[0xf] + 0x118));
  if ((uVar1 == 0) != (uVar2 == 0)) {
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 1));
    poVar3 = std::operator<<(poVar3,": Both or neither of --max_endpoints and");
    poVar3 = std::operator<<(poVar3," --max_selectors must be specified.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    (**(code **)(*in_RDI + 8))();
    exit(1);
  }
  uVar1 = clampedOption::operator_cast_to_unsigned_int((clampedOption *)(in_RDI[0xf] + 0xf8));
  if (uVar1 != 0) {
    uVar1 = clampedOption::operator_cast_to_unsigned_int((clampedOption *)(in_RDI[0xf] + 0x108));
    uVar2 = clampedOption::operator_cast_to_unsigned_int((clampedOption *)(in_RDI[0xf] + 0x118));
    if (uVar1 + uVar2 != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 1));
      poVar3 = std::operator<<(poVar3,": Warning: ignoring --qlevel as it, --max_endpoints");
      poVar3 = std::operator<<(poVar3," and --max_selectors are all set.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void
scApp::validateOptions() {
    if ((options.bopts.maxEndpoints == 0) ^ (options.bopts.maxSelectors == 0)) {
        cerr << name << ": Both or neither of --max_endpoints and"
             << " --max_selectors must be specified." << endl;
        usage();
        exit(1);
    }
    if (options.bopts.qualityLevel
        && (options.bopts.maxEndpoints + options.bopts.maxSelectors)) {
        cerr << name << ": Warning: ignoring --qlevel as it, --max_endpoints"
             << " and --max_selectors are all set." << endl;
    }
}